

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::SonarQubeReporter(SonarQubeReporter *this,ReporterConfig *config)

{
  ostream *os;
  ReporterConfig *config_local;
  SonarQubeReporter *this_local;
  
  CumulativeReporterBase::CumulativeReporterBase(&this->super_CumulativeReporterBase,config);
  (this->super_CumulativeReporterBase).super_IStreamingReporter._vptr_IStreamingReporter =
       (_func_int **)&PTR__SonarQubeReporter_003e7900;
  os = ReporterConfig::stream(config);
  XmlWriter::XmlWriter(&this->xml,os);
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.shouldRedirectStdOut =
       true;
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.
  shouldReportAllAssertions = true;
  return;
}

Assistant:

SonarQubeReporter(ReporterConfig const& config)
        : CumulativeReporterBase(config)
        , xml(config.stream()) {
            m_preferences.shouldRedirectStdOut = true;
            m_preferences.shouldReportAllAssertions = true;
        }